

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O0

void __thiscall
IR::MultiBranchInstr::MapMultiBrLabels<IR::Instr::Dump(IRDumpFlags)::__1>(MultiBranchInstr *this)

{
  MultiBranchInstr *this_local;
  
  MapMultiBrTargetByAddress<IR::MultiBranchInstr::MapMultiBrLabels<IR::Instr::Dump(IRDumpFlags)::__1>(IR::Instr::Dump(IRDumpFlags)::__1)::_lambda(void**)_1_>
            (this);
  return;
}

Assistant:

void MapMultiBrLabels(Fn fn)
    {
        MapMultiBrTargetByAddress([fn](void ** value) -> void
        {
            fn((LabelInstr*) *value);
        });
    }